

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_ilvr_w_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  float64 fVar2;
  float64 fVar3;
  
  fVar2 = (env->active_fpu).fpr[ws].fd;
  fVar3 = (env->active_fpu).fpr[wt].fd;
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar1->fs[0] = (float32)fVar3;
  pfVar1->fs[1] = (float32)fVar2;
  pfVar1->fs[2] = (float32)(fVar3 >> 0x20);
  pfVar1->fs[3] = (float32)(fVar2 >> 0x20);
  return;
}

Assistant:

void helper_msa_ilvr_w(CPUMIPSState *env,
                       uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

#if defined(HOST_WORDS_BIGENDIAN)
    pwd->w[2] = pws->w[0];
    pwd->w[3] = pwt->w[0];
    pwd->w[0] = pws->w[1];
    pwd->w[1] = pwt->w[1];
#else
    pwd->w[3] = pws->w[1];
    pwd->w[2] = pwt->w[1];
    pwd->w[1] = pws->w[0];
    pwd->w[0] = pwt->w[0];
#endif
}